

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnBrIf(TypeChecker *this,Index depth)

{
  Result RVar1;
  Result RVar2;
  Enum EVar3;
  TypeVector *pTVar4;
  Label *label;
  
  RVar1 = PopAndCheck1Type(this,(Type)0xffffffff,"br_if");
  RVar2 = GetLabel(this,depth,&label);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    pTVar4 = &label->result_types;
    if (label->label_type == Loop) {
      pTVar4 = &label->param_types;
    }
    RVar2 = PopAndCheckSignature(this,pTVar4,"br_if");
    EVar3 = (Enum)(RVar2.enum_ == Error || RVar1.enum_ == Error);
    pTVar4 = &label->result_types;
    if (label->label_type == Loop) {
      pTVar4 = &label->param_types;
    }
    PushTypes(this,pTVar4);
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::OnBrIf(Index depth) {
  Result result = PopAndCheck1Type(Type::I32, "br_if");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  result |= PopAndCheckSignature(label->br_types(), "br_if");
  PushTypes(label->br_types());
  return result;
}